

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cc
# Opt level: O2

int main(int argc,char **argv)

{
  char *__s;
  size_t size;
  ostream *poVar1;
  HHResult64 result;
  HHKey key;
  HHStateT<1> state;
  HighwayHashCatT<1U> cat;
  unsigned_long local_1e8;
  uint64_t local_1e0 [4];
  HHStatePortable local_1c0;
  HighwayHashCatT<1U> local_140;
  
  if (argc != 2) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Please provide 1 argument with a text to hash");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  else {
    local_1e0[2] = 3;
    local_1e0[3] = 4;
    local_1e0[0] = 1;
    local_1e0[1] = 2;
    __s = argv[1];
    size = strlen(__s);
    highwayhash::Portable::HHStatePortable::Reset(&local_1c0,local_1e0);
    highwayhash::HighwayHashT<highwayhash::Portable::HHStatePortable,unsigned_long>
              (&local_1c0,__s,size,&local_1e8);
    poVar1 = std::operator<<((ostream *)&std::cout,"Hash   : ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::endl<char,std::char_traits<char>>(poVar1);
    highwayhash::HighwayHashCatT<1U>::HighwayHashCatT(&local_140,&local_1e0);
    highwayhash::HighwayHashCatT<1U>::Append(&local_140,__s,size);
    highwayhash::HighwayHashCatT<1U>::Finalize<unsigned_long>(&local_140,&local_1e8);
    poVar1 = std::operator<<((ostream *)&std::cout,"HashCat: ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  return (uint)(argc != 2);
}

Assistant:

int main(int argc, char* argv[]) {
  // We read from the args on purpose, to ensure a compile time constant will
  // not be used, for verifying assembly on the supported platforms.
  if (argc != 2) {
    std::cout << "Please provide 1 argument with a text to hash" << std::endl;
    return 1;
  }

  // Please use a different key to ensure your hashes aren't identical.
  HH_ALIGNAS(32) const HHKey key = {1, 2, 3, 4};

  // Aligning inputs to 32 bytes may help but is not required.
  const char* in = argv[1];
  const size_t size = strlen(in);

  // Type determines the hash size; can also be HHResult128 or HHResult256.
  HHResult64 result;

  // HH_TARGET_PREFERRED expands to the best specialization available for the
  // CPU detected via compiler flags (e.g. AVX2 #ifdef __AVX2__).
  HHStateT<HH_TARGET_PREFERRED> state(key);
  HighwayHashT(&state, in, size, &result);
  std::cout << "Hash   : " << result << std::endl;

  HighwayHashCatT<HH_TARGET_PREFERRED> cat(key);
  cat.Append(in, size);
  cat.Finalize(&result);
  std::cout << "HashCat: " << result << std::endl;
  return 0;
}